

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O0

void pzshape::TPZShapeDisc::Shape
               (int dimension,REAL C,TPZVec<double> *X0,TPZVec<double> *X,int degree,
               TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,MShapeType type)

{
  ostream *poVar1;
  int in_ECX;
  TPZVec<double> *in_RDX;
  TPZVec<double> *in_RSI;
  undefined4 in_EDI;
  TPZFMatrix<double> *in_R8;
  TPZFMatrix<double> *in_R9;
  REAL in_XMM0_Qa;
  int in_stack_00000008;
  size_t in_stack_000003d8;
  char *in_stack_000003e0;
  MShapeType in_stack_000008a4;
  TPZFMatrix<double> *in_stack_000008a8;
  TPZFMatrix<double> *in_stack_000008b0;
  int in_stack_000008bc;
  TPZVec<double> *in_stack_000008c0;
  TPZVec<double> *in_stack_000008c8;
  REAL in_stack_000008d0;
  MShapeType in_stack_00005794;
  TPZFMatrix<double> *in_stack_00005798;
  TPZFMatrix<double> *in_stack_000057a0;
  int in_stack_000057ac;
  TPZVec<double> *in_stack_000057b0;
  TPZVec<double> *in_stack_000057b8;
  REAL in_stack_000057c0;
  MShapeType in_stack_0000c104;
  TPZFMatrix<double> *in_stack_0000c108;
  TPZFMatrix<double> *in_stack_0000c110;
  int in_stack_0000c11c;
  TPZVec<double> *in_stack_0000c120;
  TPZVec<double> *in_stack_0000c128;
  REAL in_stack_0000c130;
  
  switch(in_EDI) {
  case 0:
    Shape0D(in_XMM0_Qa,in_RSI,in_RDX,in_ECX,in_R8,in_R9);
    break;
  case 1:
    Shape1D(in_XMM0_Qa,in_RSI,in_RDX,in_ECX,in_R8,in_R9);
    break;
  case 2:
    if ((in_stack_00000008 == 0) || (in_stack_00000008 == 1)) {
      Shape2D(in_stack_000057c0,in_stack_000057b8,in_stack_000057b0,in_stack_000057ac,
              in_stack_000057a0,in_stack_00005798,in_stack_00005794);
    }
    else {
      Shape2DFull(in_stack_000008d0,in_stack_000008c8,in_stack_000008c0,in_stack_000008bc,
                  in_stack_000008b0,in_stack_000008a8,in_stack_000008a4);
    }
    break;
  case 3:
    Shape3D(in_stack_0000c130,in_stack_0000c128,in_stack_0000c120,in_stack_0000c11c,
            in_stack_0000c110,in_stack_0000c108,in_stack_0000c104);
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cerr,"\nFATAL ERROR at ");
    poVar1 = std::operator<<(poVar1,
                             "static void pzshape::TPZShapeDisc::Shape(int, REAL, TPZVec<REAL> &, TPZVec<REAL> &, int, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &, MShapeType)"
                            );
    std::operator<<(poVar1,"\n");
    std::ostream::flush();
    pzinternal::DebugStopImpl(in_stack_000003e0,in_stack_000003d8);
  }
  return;
}

Assistant:

void TPZShapeDisc::Shape(int dimension, REAL C,TPZVec<REAL> &X0,TPZVec<REAL> &X,int degree,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi, MShapeType type){
  switch (dimension){
    case(0) :{
      TPZShapeDisc::Shape0D(C,X0,X,degree,phi,dphi);
      break;
    }
    case(1) : {
      TPZShapeDisc::Shape1D(C,X0,X,degree,phi,dphi);
      break;
    }
    case(2) : {
      if(type == ETensorial || type == EOrdemTotal){
        TPZShapeDisc::Shape2D(C,X0,X,degree,phi,dphi,type);
      }
      else{
        TPZShapeDisc::Shape2DFull(C,X0,X,degree,phi,dphi,type);
      }
      break;
    }
    case(3) : {
      TPZShapeDisc::Shape3D(C,X0,X,degree,phi,dphi,type);
      break;
    }
    default:{
      PZError << "\nFATAL ERROR at " << __PRETTY_FUNCTION__ << "\n";
      PZError.flush();
      DebugStop();
    }
  }
}